

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptexnumber.cpp
# Opt level: O1

void replace_refs_in_line
               (string *line,string *pattern_in,string *pattern_out,label_idx_map *labels,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *refs,size_t line_no,bool ignore_comments)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  pointer pbVar13;
  char cVar14;
  string new_ref;
  string ref;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  size_t local_98;
  char *local_90;
  uint local_88;
  char local_80 [16];
  key_type local_70;
  pointer local_50;
  string *local_48;
  string *local_40;
  _Base_ptr local_38;
  
  local_98 = line_no;
  local_48 = pattern_in;
  local_40 = pattern_out;
  if (ignore_comments) {
    uVar4 = std::__cxx11::string::find((char)line,0x25);
  }
  else {
    uVar4 = line->_M_string_length;
  }
  pbVar13 = (refs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (refs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 != local_50) {
    local_38 = &(labels->_M_t)._M_impl.super__Rb_tree_header._M_header;
    do {
      uVar5 = std::__cxx11::string::find((char *)line,(ulong)(pbVar13->_M_dataplus)._M_p,0);
      if (uVar5 <= uVar4 && uVar5 != 0xffffffffffffffff) {
        do {
          uVar6 = std::__cxx11::string::find((char)line,0x7d);
          if (uVar6 == 0xffffffffffffffff) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"PARSING ERROR: No matching \'}\'");
            poVar9 = std::operator<<(poVar9," on line ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_98);
            std::operator<<(poVar9,'\n');
            exit(1);
          }
          uVar5 = uVar5 + pbVar13->_M_string_length;
          std::__cxx11::string::substr((ulong)&local_70,(ulong)line);
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::find(&labels->_M_t,&local_70);
          if (cVar7._M_node == local_38) {
            iVar3 = std::__cxx11::string::compare
                              ((ulong)&local_70,0,(string *)local_48->_M_string_length);
            if (iVar3 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"PARSING WARNING: Undefined ",0x1b);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(pbVar13->_M_dataplus)._M_p,
                                  pbVar13->_M_string_length);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_70._M_dataplus._M_p,local_70._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"} on line ",10);
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
              local_b8 = (long *)CONCAT71(local_b8._1_7_,10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_b8,1);
            }
          }
          else {
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::at(labels,&local_70);
            __val = *pmVar8;
            cVar14 = '\x01';
            if (9 < __val) {
              uVar11 = __val;
              cVar2 = '\x04';
              do {
                cVar14 = cVar2;
                if (uVar11 < 100) {
                  cVar14 = cVar14 + -2;
                  goto LAB_0010621c;
                }
                if (uVar11 < 1000) {
                  cVar14 = cVar14 + -1;
                  goto LAB_0010621c;
                }
                if (uVar11 < 10000) goto LAB_0010621c;
                bVar1 = 99999 < uVar11;
                uVar11 = uVar11 / 10000;
                cVar2 = cVar14 + '\x04';
              } while (bVar1);
              cVar14 = cVar14 + '\x01';
            }
LAB_0010621c:
            local_90 = local_80;
            std::__cxx11::string::_M_construct((ulong)&local_90,cVar14);
            std::__detail::__to_chars_10_impl<unsigned_long>(local_90,local_88,__val);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_90,0,(char *)0x0,
                                         (ulong)(local_40->_M_dataplus)._M_p);
            local_b8 = &local_a8;
            plVar12 = plVar10 + 2;
            if ((long *)*plVar10 == plVar12) {
              local_a8 = *plVar12;
              lStack_a0 = plVar10[3];
            }
            else {
              local_a8 = *plVar12;
              local_b8 = (long *)*plVar10;
            }
            local_b0 = plVar10[1];
            *plVar10 = (long)plVar12;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if (local_90 != local_80) {
              operator_delete(local_90);
            }
            std::__cxx11::string::replace((ulong)line,uVar5,(char *)(uVar6 - uVar5),(ulong)local_b8)
            ;
            if (local_b8 != &local_a8) {
              operator_delete(local_b8);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          uVar5 = std::__cxx11::string::find((char *)line,(ulong)(pbVar13->_M_dataplus)._M_p,uVar6);
        } while ((uVar5 != 0xffffffffffffffff) && (uVar5 <= uVar4));
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != local_50);
  }
  return;
}

Assistant:

void replace_refs_in_line(std::string& line, const std::string& pattern_in,
                          const std::string& pattern_out,
                          const label_idx_map& labels,
                          const std::vector<std::string>& refs,
                          std::size_t line_no, bool ignore_comments) {
    std::size_t pos_comment = ignore_comments ? line.find('%') : line.size();
    // for all reference types
    for (auto&& elem : refs) {
        std::string::size_type start;
        std::string::size_type end = 0;
        while (true) {
            start = line.find(elem, end);
            if (start == std::string::npos || start > pos_comment) {
                break;
            }
            end = line.find('}', start);
            if (end == std::string::npos) {
                std::cerr << "PARSING ERROR: No matching '}'" << " on line "
                          << line_no << '\n';
                std::exit(EXIT_FAILURE);
            }

            auto start_replace = start + elem.size();
            auto count = end - (start + elem.size());
            std::string ref = line.substr(start_replace, count);
            auto found = labels.find(ref);
            if (found != labels.end()) {
                // construct the new reference
                std::string new_ref =
                    pattern_out + std::to_string(labels.at(ref));
                line.replace(start_replace, count, new_ref);
            }
            // the reference starts with pattern_in but it is not in the labels
            // map
            else if (ref.compare(0, pattern_in.size(), pattern_in) == 0) {
                std::cerr << "PARSING WARNING: Undefined " << elem << ref
                          << "} on line " << line_no << '\n';
            }
        }
    }
}